

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pred_common.h
# Opt level: O1

int get_tx_size_context(MACROBLOCKD *xd)

{
  MB_MODE_INFO *pMVar1;
  uint uVar2;
  uint uVar3;
  byte bVar4;
  
  uVar2 = (uint)*xd->above_txfm_context;
  if ((xd->up_available == true) &&
     ((pMVar1 = xd->above_mbmi, (pMVar1->field_0xa7 & 0x80) != 0 || ('\0' < pMVar1->ref_frame[0]))))
  {
    uVar2 = (uint)block_size_wide[pMVar1->bsize];
  }
  bVar4 = *xd->left_txfm_context;
  if ((xd->left_available != false) &&
     ((pMVar1 = xd->left_mbmi, (pMVar1->field_0xa7 & 0x80) != 0 || ('\0' < pMVar1->ref_frame[0]))))
  {
    bVar4 = block_size_high[pMVar1->bsize];
  }
  uVar3 = 0;
  if (xd->left_available != false) {
    uVar3 = (uint)(tx_size_high[""[(*xd->mi)->bsize]] <= (int)(uint)bVar4);
  }
  uVar2 = (tx_size_wide[""[(*xd->mi)->bsize]] <= (int)uVar2) + uVar3;
  if (xd->up_available == false) {
    uVar2 = uVar3;
  }
  return uVar2;
}

Assistant:

static inline int get_tx_size_context(const MACROBLOCKD *xd) {
  const MB_MODE_INFO *mbmi = xd->mi[0];
  const MB_MODE_INFO *const above_mbmi = xd->above_mbmi;
  const MB_MODE_INFO *const left_mbmi = xd->left_mbmi;
  const TX_SIZE max_tx_size = max_txsize_rect_lookup[mbmi->bsize];
  const int max_tx_wide = tx_size_wide[max_tx_size];
  const int max_tx_high = tx_size_high[max_tx_size];
  const int has_above = xd->up_available;
  const int has_left = xd->left_available;

  int above = xd->above_txfm_context[0] >= max_tx_wide;
  int left = xd->left_txfm_context[0] >= max_tx_high;

  if (has_above)
    if (is_inter_block(above_mbmi))
      above = block_size_wide[above_mbmi->bsize] >= max_tx_wide;

  if (has_left)
    if (is_inter_block(left_mbmi))
      left = block_size_high[left_mbmi->bsize] >= max_tx_high;

  if (has_above && has_left)
    return (above + left);
  else if (has_above)
    return above;
  else if (has_left)
    return left;
  else
    return 0;
}